

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O2

void __thiscall LinearScan::TrackInlineeArgLifetimes(LinearScan *this,Instr *instr)

{
  uint32 uVar1;
  LinearScan *pLVar2;
  ArgList *pAVar3;
  code *pcVar4;
  bool bVar5;
  InlineeFrameInfoValueType IVar6;
  int iVar7;
  undefined4 *puVar8;
  Func *pFVar9;
  Func **ppFVar10;
  JITTimeFunctionBody *this_00;
  intptr_t functionBodyAddr;
  Func *pFVar11;
  char *message;
  char *error;
  long lVar12;
  uint lineNumber;
  LoweredBasicBlock *pLVar13;
  char *fileName;
  uint uVar14;
  Type pIVar15;
  int i;
  InlineeFrameInfo *pIVar16;
  long lVar17;
  Func **item;
  anon_class_8_1_8991fb9c_for_callback local_48;
  anon_class_8_1_8991fb9c_for_callback local_40;
  LinearScan *local_38;
  
  if (instr->m_opcode != InlineeEnd) {
    if (instr->m_opcode == InlineeStart) {
      pFVar9 = instr->m_func;
      item = &instr->m_func;
      if ((pFVar9->field_0x240 & 2) == 0) {
        if ((pFVar9->parentFunc->field_0x240 & 2) == 0) {
          return;
        }
        if (pFVar9->frameInfo != (InlineeFrameInfo *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar8 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                             ,0xd95,"(!instr->m_func->frameInfo)","!instr->m_func->frameInfo");
          if (!bVar5) goto LAB_0053719c;
          *puVar8 = 0;
          pFVar9 = *item;
        }
        if (pFVar9->cachedInlineeFrameInfo == (InlineeFrameInfo *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar8 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                             ,0xd96,"(instr->m_func->cachedInlineeFrameInfo)",
                             "instr->m_func->cachedInlineeFrameInfo");
          if (!bVar5) goto LAB_0053719c;
          *puVar8 = 0;
        }
        if (((this->currentBlock->inlineeStack).
             super_ReadOnlyList<Func_*,_Memory::JitArenaAllocator,_DefaultComparer>.count != 0) &&
           (uVar1 = (*item)->inlineDepth,
           ppFVar10 = JsUtil::
                      List<Func_*,_Memory::JitArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                      ::Last(&this->currentBlock->inlineeStack),
           uVar1 != (*ppFVar10)->inlineDepth + 1)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar8 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                             ,0xd98,
                             "(this->currentBlock->inlineeStack.Empty() || instr->m_func->inlineDepth == this->currentBlock->inlineeStack.Last()->inlineDepth + 1)"
                             ,
                             "this->currentBlock->inlineeStack.Empty() || instr->m_func->inlineDepth == this->currentBlock->inlineeStack.Last()->inlineDepth + 1"
                            );
          if (!bVar5) goto LAB_0053719c;
          *puVar8 = 0;
        }
        pLVar13 = this->currentBlock;
      }
      else {
        pIVar16 = pFVar9->frameInfo;
        pAVar3 = pIVar16->arguments;
        local_48.this = this;
        local_40.this = this;
        local_38 = this;
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        lVar12 = 0;
        for (lVar17 = 0; pLVar2 = local_38,
            lVar17 < (pAVar3->
                     super_ReadOnlyList<InlineFrameInfoValue,_Memory::JitArenaAllocator,_DefaultComparer>
                     ).count; lVar17 = lVar17 + 1) {
          pIVar15 = (pAVar3->
                    super_ReadOnlyList<InlineFrameInfoValue,_Memory::JitArenaAllocator,_DefaultComparer>
                    ).buffer;
          iVar7 = *(int *)((long)&pIVar15->type + lVar12);
          if (iVar7 == 1) {
            InlineeFrameInfo::
            IterateSyms<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp:3454:51)>
            ::anon_class_8_1_dda845c3::anon_class_8_1_8991fb9c_for_callback::operator()
                      ((anon_class_8_1_8991fb9c_for_callback *)&local_48,
                       *(StackSym **)((long)&pIVar15->field_1 + lVar12));
            iVar7 = *(int *)((long)&pIVar15->type + lVar12);
          }
          if (iVar7 == 0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar8 = 1;
            bVar5 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InlineeFrameInfo.h"
                               ,0xaf,"(value.type != InlineeFrameInfoValueType_None)",
                               "value.type != InlineeFrameInfoValueType_None");
            if (!bVar5) goto LAB_0053719c;
            *puVar8 = 0;
          }
          lVar12 = lVar12 + 0x18;
        }
        IVar6 = (pIVar16->function).type;
        if (IVar6 == InlineeFrameInfoValueType_None) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar8 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InlineeFrameInfo.h"
                             ,0xbf,"(function.type != InlineeFrameInfoValueType_None)",
                             "function.type != InlineeFrameInfoValueType_None");
          if (!bVar5) goto LAB_0053719c;
          *puVar8 = 0;
          IVar6 = (pIVar16->function).type;
        }
        if (IVar6 == InlineeFrameInfoValueType_Sym) {
          InlineeFrameInfo::
          IterateSyms<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp:3454:51)>
          ::anon_class_8_1_dda845c3::anon_class_8_1_8991fb9c_for_callback::operator()
                    ((anon_class_8_1_8991fb9c_for_callback *)&local_40,
                     (pIVar16->function).field_1.sym);
        }
        pLVar13 = pLVar2->currentBlock;
        if ((0 < (pLVar13->inlineeStack).
                 super_ReadOnlyList<Func_*,_Memory::JitArenaAllocator,_DefaultComparer>.count) &&
           (uVar14 = (*item)->inlineDepth,
           ppFVar10 = JsUtil::
                      List<Func_*,_Memory::JitArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                      ::Last(&pLVar13->inlineeStack), uVar14 <= (*ppFVar10)->inlineDepth)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar8 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                             ,0xd8f,
                             "(instr->m_func->inlineDepth > this->currentBlock->inlineeStack.Last()->inlineDepth)"
                             ,
                             "instr->m_func->inlineDepth > this->currentBlock->inlineeStack.Last()->inlineDepth"
                            );
          if (!bVar5) goto LAB_0053719c;
          *puVar8 = 0;
        }
        pLVar13 = pLVar2->currentBlock;
      }
      JsUtil::List<Func_*,_Memory::JitArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
      ::Add(&pLVar13->inlineeStack,item);
      return;
    }
    bVar5 = IR::Instr::HasBailOnNoProfile(instr);
    if (!bVar5) {
      return;
    }
  }
  pFVar9 = instr->m_func;
  if ((pFVar9->field_0x240 & 2) == 0) {
    if (pFVar9->parentFunc == (Func *)0x0) {
      return;
    }
    if ((pFVar9->parentFunc->field_0x240 & 2) == 0) {
      return;
    }
    pIVar16 = pFVar9->cachedInlineeFrameInfo;
    if (pIVar16 == (InlineeFrameInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar8 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                         ,0xda3,"(instr->m_func->cachedInlineeFrameInfo)",
                         "instr->m_func->cachedInlineeFrameInfo");
      if (!bVar5) goto LAB_0053719c;
      *puVar8 = 0;
      pFVar9 = instr->m_func;
      pIVar16 = pFVar9->cachedInlineeFrameInfo;
    }
    pFVar9->frameInfo = pIVar16;
  }
  else {
    pIVar16 = pFVar9->frameInfo;
  }
  this_00 = Func::GetJITFunctionBody(pFVar9);
  functionBodyAddr = JITTimeFunctionBody::GetAddr(this_00);
  InlineeFrameInfo::AllocateRecord(pIVar16,pFVar9,functionBodyAddr);
  pLVar13 = this->currentBlock;
  if ((pLVar13->inlineeStack).super_ReadOnlyList<Func_*,_Memory::JitArenaAllocator,_DefaultComparer>
      .count == 0) {
    if ((pLVar13->inlineeFrameLifetimes).
        super_ReadOnlyList<Lifetime_*,_Memory::JitArenaAllocator,_DefaultComparer>.count != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar8 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                         ,0xdab,"(this->currentBlock->inlineeFrameLifetimes.Count() == 0)",
                         "this->currentBlock->inlineeFrameLifetimes.Count() == 0");
      if (!bVar5) goto LAB_0053719c;
      *puVar8 = 0;
      pLVar13 = this->currentBlock;
    }
    if ((pLVar13->inlineeFrameSyms).count == (pLVar13->inlineeFrameSyms).freeCount) {
      return;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    fileName = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
    ;
    error = "(this->currentBlock->inlineeFrameSyms.Count() == 0)";
    message = "this->currentBlock->inlineeFrameSyms.Count() == 0";
    lineNumber = 0xdac;
  }
  else {
    pFVar11 = JsUtil::
              List<Func_*,_Memory::JitArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
              ::RemoveAtEnd(&pLVar13->inlineeStack);
    pFVar9 = instr->m_func;
    if (pFVar11 != pFVar9) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar8 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                         ,0xdb1,"(func == instr->m_func)","func == instr->m_func");
      if (!bVar5) goto LAB_0053719c;
      *puVar8 = 0;
      pFVar9 = instr->m_func;
    }
    if ((pFVar9->field_0x240 & 2) == 0) {
      return;
    }
    pLVar2 = (LinearScan *)pFVar9->frameInfo;
    local_40.this = this;
    if (((InlineFrameInfoValue *)&pLVar2->func)->type == InlineeFrameInfoValueType_Sym) {
      InlineeFrameInfo::
      IterateSyms<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp:3509:59)>
      ::anon_class_8_1_dda845c3::anon_class_8_1_8991fb9c_for_callback::operator()
                (&local_40,
                 ((anon_union_16_2_3c23d1fc_for_InlineFrameInfoValue_1 *)&pLVar2->tempAlloc)->sym);
    }
    pAVar3 = *(ArgList **)&pLVar2->currentBlockNumber;
    uVar14 = (pAVar3->
             super_ReadOnlyList<InlineFrameInfoValue,_Memory::JitArenaAllocator,_DefaultComparer>).
             count;
    local_48.this = this;
    local_38 = pLVar2;
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    while (uVar14 = uVar14 - 1, -1 < (int)uVar14) {
      pIVar15 = (pAVar3->
                super_ReadOnlyList<InlineFrameInfoValue,_Memory::JitArenaAllocator,_DefaultComparer>
                ).buffer;
      IVar6 = pIVar15[uVar14 & 0x7fffffff].type;
      if (IVar6 == InlineeFrameInfoValueType_Sym) {
        pIVar15 = pIVar15 + (uVar14 & 0x7fffffff);
        InlineeFrameInfo::
        IterateSyms<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp:3509:59)>
        ::anon_class_8_1_dda845c3::anon_class_8_1_8991fb9c_for_callback::operator()
                  (&local_48,(pIVar15->field_1).sym);
        IVar6 = pIVar15->type;
      }
      if (IVar6 == InlineeFrameInfoValueType_None) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar8 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InlineeFrameInfo.h"
                           ,0xaf,"(value.type != InlineeFrameInfoValueType_None)",
                           "value.type != InlineeFrameInfoValueType_None");
        if (!bVar5) goto LAB_0053719c;
        *puVar8 = 0;
      }
    }
    if (((InlineFrameInfoValue *)&local_38->func)->type != InlineeFrameInfoValueType_None) {
      return;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar8 = 1;
    fileName = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InlineeFrameInfo.h"
    ;
    error = "(function.type != InlineeFrameInfoValueType_None)";
    message = "function.type != InlineeFrameInfoValueType_None";
    lineNumber = 0xbf;
  }
  bVar5 = Js::Throw::ReportAssert(fileName,lineNumber,error,message);
  if (bVar5) {
    *puVar8 = 0;
    return;
  }
LAB_0053719c:
  pcVar4 = (code *)invalidInstructionException();
  (*pcVar4)();
}

Assistant:

void LinearScan::TrackInlineeArgLifetimes(IR::Instr* instr)
{
    if (instr->m_opcode == Js::OpCode::InlineeStart)
    {
        if (instr->m_func->m_hasInlineArgsOpt)
        {
            instr->m_func->frameInfo->IterateSyms([=](StackSym* sym){
                Lifetime* lifetime = sym->scratch.linearScan.lifetime;
                this->currentBlock->inlineeFrameLifetimes.Add(lifetime);

                // We need to maintain as count because the same sym can be used for multiple arguments
                uint* value;
                if (this->currentBlock->inlineeFrameSyms.TryGetReference(sym->m_id, &value))
                {
                    *value = *value + 1;
                }
                else
                {
                    this->currentBlock->inlineeFrameSyms.Add(sym->m_id, 1);
                }
            });
            if (this->currentBlock->inlineeStack.Count() > 0)
            {
                Assert(instr->m_func->inlineDepth > this->currentBlock->inlineeStack.Last()->inlineDepth);
            }
            this->currentBlock->inlineeStack.Add(instr->m_func);
        }
        else if (instr->m_func->GetParentFunc()->m_hasInlineArgsOpt)
        {
            Assert(!instr->m_func->frameInfo);
            Assert(instr->m_func->cachedInlineeFrameInfo);
            
            Assert(this->currentBlock->inlineeStack.Empty() || instr->m_func->inlineDepth == this->currentBlock->inlineeStack.Last()->inlineDepth + 1);

            this->currentBlock->inlineeStack.Add(instr->m_func);
        }
    }
    else if (instr->m_opcode == Js::OpCode::InlineeEnd || instr->HasBailOnNoProfile())
    {
        if (instr->m_func->m_hasInlineArgsOpt || (instr->m_func->GetParentFunc() && instr->m_func->GetParentFunc()->m_hasInlineArgsOpt))
        {
            if (!instr->m_func->m_hasInlineArgsOpt)
            {
                Assert(instr->m_func->cachedInlineeFrameInfo);
                instr->m_func->frameInfo = instr->m_func->cachedInlineeFrameInfo;
            }
            instr->m_func->frameInfo->AllocateRecord(instr->m_func, instr->m_func->GetJITFunctionBody()->GetAddr());

            if(this->currentBlock->inlineeStack.Count() == 0)
            {
                // Block is unreachable
                Assert(this->currentBlock->inlineeFrameLifetimes.Count() == 0);
                Assert(this->currentBlock->inlineeFrameSyms.Count() == 0);
            }
            else
            {
                Func* func = this->currentBlock->inlineeStack.RemoveAtEnd();
                Assert(func == instr->m_func);

                if (instr->m_func->m_hasInlineArgsOpt)
                {
                    instr->m_func->frameInfo->IterateSyms([=](StackSym* sym) {
                        Lifetime* lifetime = this->currentBlock->inlineeFrameLifetimes.RemoveAtEnd();

                        uint* value;
                        if (this->currentBlock->inlineeFrameSyms.TryGetReference(sym->m_id, &value))
                        {
                            *value = *value - 1;
                            if (*value == 0)
                            {
                                bool removed = this->currentBlock->inlineeFrameSyms.Remove(sym->m_id);
                                Assert(removed);
                            }
                        }
                        else
                        {
                            Assert(UNREACHED);
                        }
                        Assert(sym->scratch.linearScan.lifetime == lifetime);
                        }, /*reverse*/ true);
                }
            }
        }
    }
}